

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

uintptr_t lj_trace_unwind(jit_State *J,uintptr_t addr,ExitNo *ep)

{
  uint64_t uVar1;
  uint uVar2;
  SnapNo mid;
  uintptr_t ofs;
  SnapNo exitno;
  SnapNo lo;
  SnapShot *snap;
  GCtrace *T;
  TraceNo traceno;
  ExitNo *ep_local;
  uintptr_t addr_local;
  jit_State *J_local;
  
  uVar1 = J->trace[(uint)J[-1].penalty[0x30].pc.ptr64].gcptr64;
  if (((uVar1 == 0) || (addr < *(ulong *)(uVar1 + 0x58))) ||
     (*(long *)(uVar1 + 0x58) + (ulong)*(uint *)(uVar1 + 0x54) <= addr)) {
    J_local = (jit_State *)0x0;
  }
  else {
    ofs._4_4_ = 0;
    ofs._0_4_ = (uint)*(ushort *)(uVar1 + 10);
    do {
      uVar2 = ofs._4_4_ + (uint)ofs >> 1;
      if ((ulong)*(ushort *)(*(long *)(uVar1 + 0x30) + (ulong)uVar2 * 0xc + 6) <=
          addr - *(long *)(uVar1 + 0x58)) {
        ofs._4_4_ = uVar2 + 1;
        uVar2 = (uint)ofs;
      }
      ofs._0_4_ = uVar2;
    } while (ofs._4_4_ < (uint)ofs);
    uVar2 = (uint)ofs - 1;
    *ep = uVar2;
    J_local = (jit_State *)(J->exitstubgroup[uVar2 >> 5] + ((uVar2 & 0x1f) << 2));
  }
  return (uintptr_t)J_local;
}

Assistant:

uintptr_t LJ_FASTCALL lj_trace_unwind(jit_State *J, uintptr_t addr, ExitNo *ep)
{
#if EXITTRACE_VMSTATE
  TraceNo traceno = J2G(J)->vmstate;
#else
  TraceNo traceno = trace_exit_find(J, (MCode *)addr);
#endif
  GCtrace *T = traceref(J, traceno);
  if (T
#if EXITTRACE_VMSTATE
      && addr >= (uintptr_t)T->mcode && addr < (uintptr_t)T->mcode + T->szmcode
#endif
     ) {
    SnapShot *snap = T->snap;
    SnapNo lo = 0, exitno = T->nsnap;
    uintptr_t ofs = (uintptr_t)((MCode *)addr - T->mcode);  /* MCode units! */
    /* Rightmost binary search for mcode offset to determine exit number. */
    do {
      SnapNo mid = (lo+exitno) >> 1;
      if (ofs < snap[mid].mcofs) exitno = mid; else lo = mid + 1;
    } while (lo < exitno);
    exitno--;
    *ep = exitno;
#ifdef EXITSTUBS_PER_GROUP
    return (uintptr_t)exitstub_addr(J, exitno);
#else
    return (uintptr_t)exitstub_trace_addr(T, exitno);
#endif
  }
  /* Cannot correlate addr with trace/exit. This will be fatal. */
  lj_assertJ(0, "bad exit pc");
  return 0;
}